

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O0

void __thiscall piece_data::set(piece_data *this,Color *c,Piece *p,Square *s,info *ifo)

{
  value_type vVar1;
  value_type_conflict1 vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  ulong uVar6;
  reference this_00;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference this_01;
  reference this_02;
  reference pvVar12;
  reference this_03;
  reference this_04;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  U64 UVar16;
  info *ifo_local;
  Square *s_local;
  Piece *p_local;
  Color *c_local;
  piece_data *this_local;
  
  uVar6 = (&bitboards::squares)[*s];
  this_00 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[](&this->bitmap,(ulong)*c);
  pvVar7 = std::array<unsigned_long,_64UL>::operator[](this_00,(ulong)*p);
  *pvVar7 = uVar6 | *pvVar7;
  uVar6 = (&bitboards::squares)[*s];
  pvVar8 = std::array<unsigned_long,_2UL>::operator[](&this->bycolor,(ulong)*c);
  *pvVar8 = uVar6 | *pvVar8;
  vVar1 = *c;
  pvVar9 = std::array<Color,_64UL>::operator[](&this->color_on,(ulong)*s);
  *pvVar9 = vVar1;
  pvVar10 = std::array<std::array<int,_6UL>,_2UL>::operator[](&this->number_of,(ulong)*c);
  pvVar11 = std::array<int,_6UL>::operator[](pvVar10,(ulong)*p);
  *pvVar11 = *pvVar11 + 1;
  pvVar10 = std::array<std::array<int,_6UL>,_2UL>::operator[](&this->number_of,(ulong)*c);
  pvVar11 = std::array<int,_6UL>::operator[](pvVar10,(ulong)*p);
  vVar2 = *pvVar11;
  this_01 = std::array<std::array<std::array<int,_64UL>,_6UL>,_2UL>::operator[]
                      (&this->piece_idx,(ulong)*c);
  this_02 = std::array<std::array<int,_64UL>,_6UL>::operator[](this_01,(ulong)*p);
  pvVar12 = std::array<int,_64UL>::operator[](this_02,(ulong)*s);
  *pvVar12 = vVar2;
  vVar3 = *s;
  this_03 = std::array<std::array<std::array<Square,_11UL>,_6UL>,_2UL>::operator[]
                      (&this->square_of,(ulong)*c);
  this_04 = std::array<std::array<Square,_11UL>,_6UL>::operator[](this_03,(ulong)*p);
  pvVar10 = std::array<std::array<int,_6UL>,_2UL>::operator[](&this->number_of,(ulong)*c);
  pvVar11 = std::array<int,_6UL>::operator[](pvVar10,(ulong)*p);
  pvVar13 = std::array<Square,_11UL>::operator[](this_04,(long)*pvVar11);
  *pvVar13 = vVar3;
  vVar4 = *p;
  pvVar14 = std::array<Piece,_64UL>::operator[](&this->piece_on,(ulong)*s);
  *pvVar14 = vVar4;
  if (*p == king) {
    vVar5 = *s;
    pvVar15 = std::array<Square,_2UL>::operator[](&this->king_sq,(ulong)*c);
    *pvVar15 = vVar5;
  }
  UVar16 = zobrist::piece(s,c,p);
  ifo->key = UVar16 ^ ifo->key;
  UVar16 = zobrist::piece(s,c,p);
  ifo->mkey = UVar16 ^ ifo->mkey;
  UVar16 = zobrist::piece(s,c,p);
  ifo->repkey = UVar16 ^ ifo->repkey;
  if (*p == pawn) {
    UVar16 = zobrist::piece(s,c,p);
    ifo->pawnkey = UVar16 ^ ifo->pawnkey;
  }
  return;
}

Assistant:

inline void piece_data::set(const Color& c, const Piece& p, const Square& s, info& ifo) {
	bitmap[c][p] |= bitboards::squares[s];
	bycolor[c] |= bitboards::squares[s];
	color_on[s] = c;
	number_of[c][p] += 1;
	piece_idx[c][p][s] = number_of[c][p];
	square_of[c][p][number_of[c][p]] = s;
	piece_on[s] = p;
	if (p == Piece::king) king_sq[c] = s;

	ifo.key ^= zobrist::piece(s, c, p);
	ifo.mkey ^= zobrist::piece(s, c, p);
	ifo.repkey ^= zobrist::piece(s, c, p);
	if (p == Piece::pawn) ifo.pawnkey ^= zobrist::piece(s, c, p);
}